

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void notch::core::internal::conv2d<3ul,float*,float*>
               (float *image,size_t imageWidth,size_t imageHeight,float *kernel,float *result)

{
  float fVar1;
  float *result_rc;
  float *image_rc;
  size_t c;
  OMP_size_t r;
  size_t resultHeight;
  size_t resultWidth;
  float *image_topleft;
  size_t pad;
  float *result_local;
  float *kernel_local;
  size_t imageHeight_local;
  size_t imageWidth_local;
  float *image_local;
  
  for (c = 0; c < imageHeight - 2; c = c + 1) {
    for (image_rc = (float *)0x0; image_rc < (float *)(imageWidth - 2);
        image_rc = (float *)((long)image_rc + 1)) {
      fVar1 = conv2dAt<3ul,float*>
                        (image + (long)image_rc + imageWidth + c * imageWidth + 1,imageWidth,kernel)
      ;
      result[(long)(c * (long)(imageWidth - 2) + (long)image_rc)] = fVar1;
    }
  }
  return;
}

Assistant:

void
conv2d(Iter image, const size_t imageWidth, const size_t imageHeight,
       Iter kernel, OutIter result) {
    size_t pad = kernelSize/2;
    Iter image_topleft = image + pad*imageWidth + pad;
    size_t resultWidth = imageWidth - kernelSize + 1;
    size_t resultHeight = imageHeight - kernelSize + 1;
#ifdef NOTCH_USE_OPENMP
#pragma omp parallel for shared(image_topleft, kernel, resultWidth, resultHeight)
#endif
    for (OMP_size_t r = 0; r < resultHeight; ++r) {
        for (size_t c = 0; c < resultWidth; ++c) {
            Iter image_rc = image_topleft + r*imageWidth + c;
            OutIter result_rc = result + r*resultWidth + c;
            *result_rc = conv2dAt<kernelSize, Iter>(image_rc, imageWidth, kernel);
        }
    }
}